

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O2

Vec3ff __thiscall
embree::AnisotropicBlinn__sample(embree *this,AnisotropicBlinn *This,float sx,float sy)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Vec3ff VVar15;
  
  fVar5 = This->nx + 1.0;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar6 = sinf(sx * 6.2831855);
  fVar6 = fVar6 * fVar5;
  fVar5 = This->ny + 1.0;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar7 = cosf(sx * 6.2831855);
  fVar7 = fVar7 * fVar5;
  auVar14._4_4_ = extraout_XMM0_Db;
  auVar14._0_4_ = fVar7;
  auVar14._8_4_ = extraout_XMM0_Dc;
  auVar14._12_4_ = extraout_XMM0_Dd;
  auVar8._4_12_ = auVar14._4_12_;
  auVar8._0_4_ = fVar7 * fVar7 + fVar6 * fVar6;
  auVar13._4_4_ = extraout_XMM0_Db;
  auVar13._0_4_ = auVar8._0_4_;
  auVar13._8_4_ = extraout_XMM0_Dc;
  auVar13._12_4_ = extraout_XMM0_Dd;
  auVar14 = rsqrtss(auVar13,auVar8);
  fVar5 = auVar14._0_4_;
  fVar11 = fVar5 * fVar5 * auVar8._0_4_ * -0.5 * fVar5 + fVar5 * 1.5;
  fVar6 = fVar6 * fVar11;
  fVar11 = fVar11 * fVar7;
  fVar12 = fVar11 * fVar11 * This->nx + fVar6 * fVar6 * This->ny;
  fVar5 = fVar12 + 1.0;
  auVar9._4_4_ = auVar14._4_4_;
  auVar9._0_4_ = fVar5;
  auVar9._8_4_ = auVar14._8_4_;
  auVar9._12_4_ = auVar14._12_4_;
  auVar10._4_4_ = auVar14._4_4_;
  auVar10._0_4_ = fVar5;
  auVar10._8_4_ = auVar14._8_4_;
  auVar10._12_4_ = auVar14._12_4_;
  auVar10 = rcpss(auVar9,auVar10);
  fVar5 = powf(sy,(2.0 - fVar5 * auVar10._0_4_) * auVar10._0_4_);
  fVar7 = 1.0 - fVar5 * fVar5;
  if (fVar7 <= 0.0) {
    fVar7 = 0.0;
  }
  fVar1 = This->norm1;
  fVar12 = powf(fVar5,fVar12);
  VVar15.field_0._0_4_ = fVar12 * fVar1;
  fVar11 = fVar11 * SQRT(fVar7);
  fVar6 = fVar6 * SQRT(fVar7);
  fVar7 = (This->dx).field_0.m128[1];
  fVar12 = (This->dx).field_0.m128[2];
  fVar1 = (This->dy).field_0.m128[1];
  fVar2 = (This->dy).field_0.m128[2];
  fVar3 = (This->dz).field_0.m128[1];
  fVar4 = (This->dz).field_0.m128[2];
  *(float *)this =
       fVar5 * (This->dz).field_0.m128[0] +
       fVar6 * (This->dy).field_0.m128[0] + fVar11 * (This->dx).field_0.m128[0];
  *(float *)(this + 4) = fVar5 * fVar3 + fVar6 * fVar1 + fVar11 * fVar7;
  *(float *)(this + 8) = fVar5 * fVar4 + fVar6 * fVar2 + fVar11 * fVar12;
  *(float *)(this + 0xc) = VVar15.field_0._0_4_;
  VVar15.field_0.m128[1] = (float)extraout_XMM0_Db_00;
  VVar15.field_0._8_8_ = this;
  return (Vec3ff)VVar15.field_0;
}

Assistant:

inline Vec3ff AnisotropicBlinn__sample(const AnisotropicBlinn* This, const float sx, const float sy)
{
  const float phi =float(two_pi)*sx;
  const float sinPhi0 = sqrtf(This->nx+1)*sinf(phi);
  const float cosPhi0 = sqrtf(This->ny+1)*cosf(phi);
  const float norm = rsqrt(sqr(sinPhi0)+sqr(cosPhi0));
  const float sinPhi = sinPhi0*norm;
  const float cosPhi = cosPhi0*norm;
  const float n = This->nx*sqr(cosPhi)+This->ny*sqr(sinPhi);
  const float cosTheta = powf(sy,rcp(n+1));
  const float sinTheta = cos2sin(cosTheta);
  const float pdf = This->norm1*powf(cosTheta,n);
  const Vec3fa h = Vec3fa(cosPhi * sinTheta, sinPhi * sinTheta, cosTheta);
  const Vec3fa wh = h.x*This->dx + h.y*This->dy + h.z*This->dz;
  return Vec3ff(wh,pdf);
}